

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawBuffersTest::iterate(DrawBuffersTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  float fVar6;
  undefined4 extraout_var;
  undefined4 *puVar8;
  long lVar9;
  char *description;
  long lVar10;
  float fVar11;
  GLint max_color_attachments;
  GLuint framebuffer;
  GLfloat rgba [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderbuffers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> color_attachments;
  GLenum none_bufs;
  int local_208;
  int local_204;
  DrawBuffersTest *local_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  undefined4 local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_200 = this;
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_204 = 0;
    local_208 = 8;
    (**(code **)(lVar7 + 0x868))(0x8cdf,&local_208);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x60c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1e8,(long)local_208,(allocator_type *)local_1b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1d0,(long)local_208,(allocator_type *)local_1b0);
    if (0 < local_208) {
      lVar9 = 0;
      do {
        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = 0;
        local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = (int)lVar9 + 0x8ce0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_208);
    }
    (**(code **)(lVar7 + 0x6d0))(1,&local_204);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61b);
    (**(code **)(lVar7 + 0x78))(0x8d40,local_204);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61e);
    (**(code **)(lVar7 + 0x6e8))
              (local_208,
               local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x621);
    if (0 < local_208) {
      lVar9 = 0;
      do {
        (**(code **)(lVar7 + 0xa0))
                  (0x8d41,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9]);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glBindRenderbuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x627);
        (**(code **)(lVar7 + 0x1238))(0x8d41,0x8814,1,1);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glRenderbufferStorage has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x62a);
        (**(code **)(lVar7 + 0x688))
                  (0x8d40,(int)lVar9 + 0x8ce0,0x8d41,
                   local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar9]);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glFramebufferRenderbuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x62d);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_208);
    }
    iVar4 = (**(code **)(lVar7 + 0x170))(0x8d40);
    if (iVar4 != 0x8cd5) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Framebuffer is unexpectedly incomplete.",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 0;
      __cxa_throw(puVar8,&int::typeinfo,0);
    }
    (**(code **)(lVar7 + 0xef8))
              (local_204,local_208,
               local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    fVar6 = (float)(**(code **)(lVar7 + 0x800))();
    bVar2 = fVar6 == 0.0;
    if (!bVar2) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"NamedFramebufferDrawBuffers unexpectedly generated ",0x33);
      local_1f8 = (undefined1  [8])glu::getErrorName;
      fStack_1f0 = fVar6;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1f8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," error. Test fails.",0x13);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    if (0 < local_208) {
      iVar4 = 0;
      do {
        (**(code **)(lVar7 + 0x1c0))(0,0x3e800000,0x3f000000,0x3f400000);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glClearColor has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x648);
        (**(code **)(lVar7 + 0x188))(0x4000);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glClear has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x64b);
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_208);
    }
    if (0 < local_208) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      iVar4 = 0;
      do {
        (**(code **)(lVar7 + 0x1218))(iVar4 + 0x8ce0);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glReadBuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x652);
        local_1f8 = (undefined1  [8])0xbf800000bf800000;
        fStack_1f0 = -1.0;
        fStack_1ec = -1.0;
        (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1406,local_1f8);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glReadPixels has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x657);
        lVar9 = 0;
        do {
          fVar11 = *(float *)((long)&s_rgba + lVar9) - *(float *)(local_1f8 + lVar9);
          fVar6 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar6 = fVar11;
          }
          if (0.0001 < fVar6) {
            local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
                       ,0x53);
            std::ostream::_M_insert<double>((double)(float)local_1f8._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)(float)local_1f8._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_1f0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)fStack_1ec);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] but [",7);
            std::ostream::_M_insert<double>(0.0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>(0.25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>(0.5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>(0.75);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"] had been expected.",0x14);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
            break;
          }
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_208);
    }
    local_1b4 = 0;
    (**(code **)(lVar7 + 0xef8))(local_204);
    fVar6 = (float)(**(code **)(lVar7 + 0x800))();
    if (fVar6 != 0.0) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"NamedFramebufferDrawBuffers unexpectedly generated ",0x33);
      local_1f8 = (undefined1  [8])glu::getErrorName;
      fStack_1f0 = fVar6;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1f8,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," error with GL_NONE mode. Test fails.",0x25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    if (local_204 != 0) {
      (**(code **)(lVar7 + 0x440))(1);
      local_204 = 0;
    }
    if (0 < local_208) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        if (*(int *)((long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar10) != 0) {
          (**(code **)(lVar7 + 0x460))(1);
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 4;
      } while (lVar9 < local_208);
    }
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0);
    do {
      iVar4 = (**(code **)(lVar7 + 0x800))();
    } while (iVar4 != 0);
    description = "Pass";
    if (!bVar2) {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((local_200->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
               description);
    if (local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((local_200->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	glw::GLuint framebuffer = 0;

	/* Get number of color attachments. */
	glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	std::vector<glw::GLuint> renderbuffers(max_color_attachments);
	std::vector<glw::GLuint> color_attachments(max_color_attachments);

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		renderbuffers[i]	 = 0;
		color_attachments[i] = GL_COLOR_ATTACHMENT0 + i;
	}

	try
	{
		/* Prepare framebuffer... */
		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genRenderbuffers(max_color_attachments, &(renderbuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		/* .. with renderbuffer color attachments. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}

		/* Set up all attachments as draw buffer. */
		gl.namedFramebufferDrawBuffers(framebuffer, max_color_attachments, &(color_attachments[0]));

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}

		/* Clear each of the framebuffer's attachments with unique color using NamedFramebufferDrawBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.clearColor(s_rgba[0], s_rgba[1], s_rgba[2], s_rgba[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear has failed");
		}

		/* Fetch framebuffer's content and compare it with reference using NamedFramebufferReadBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");

			glw::GLfloat rgba[4] = { -1.f, -1.f, -1.f, -1.f };

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, rgba);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

			for (glw::GLuint j = 0; j < 4 /* number of components */; ++j)
			{
				if (de::abs(s_rgba[j] - rgba[j]) > 0.0001 /* Precision */)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
						<< rgba[0] << ", " << rgba[1] << ", " << rgba[2] << ", " << rgba[3] << "] but [" << s_rgba[0]
						<< ", " << s_rgba[1] << ", " << s_rgba[2] << ", " << s_rgba[3] << "] had been expected."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					break;
				}
			}
		}

		/* Check that NamedFramebufferDrawBuffers accepts GL_NONE as mode. */
		glw::GLenum none_bufs = GL_NONE;
		gl.namedFramebufferDrawBuffers(framebuffer, 1, &none_bufs);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error with GL_NONE mode. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);

		framebuffer = 0;
	}

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		if (renderbuffers[i])
		{
			gl.deleteRenderbuffers(1, &(renderbuffers[i]));
		}
	}

	gl.clearColor(0.f, 0.f, 0.f, 0.f);

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}